

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

size_t ecpCreateJ_deep(size_t n,size_t f_deep)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = n * 0x10 + f_deep;
  lVar7 = n * 0x20;
  sVar2 = utilMax(2,f_deep,lVar6);
  lVar1 = lVar7 + f_deep;
  sVar3 = utilMax(2,f_deep,lVar1);
  sVar4 = utilMax(2,f_deep,lVar6);
  sVar5 = utilMax(2,f_deep,lVar1);
  sVar2 = utilMax(0xb,n * 8,lVar6,sVar2 + lVar7,lVar7 + sVar3,sVar4 + n * 0x38,n * 0x30 + sVar5,
                  lVar6,lVar6,lVar1,n * 0x40 + f_deep,n * 0x38 + f_deep);
  return sVar2;
}

Assistant:

size_t ecpCreateJ_deep(size_t n, size_t f_deep)
{
	return utilMax(11,
		O_OF_W(n),
		ecpToAJ_deep(n, f_deep),
		ecpAddJ_deep(n, f_deep),
		ecpAddAJ_deep(n, f_deep),
		ecpSubJ_deep(n, f_deep),
		ecpSubAJ_deep(n, f_deep),
		ecpDblJ_deep(n, f_deep),
		ecpDblJA3_deep(n, f_deep),
		ecpDblAJ_deep(n, f_deep),
		ecpTplJ_deep(n, f_deep),
		ecpTplJA3_deep(n, f_deep));
}